

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_cast_helpers.hpp
# Opt level: O2

date_t __thiscall
duckdb::VectorTryCastErrorOperator<duckdb::TryCastErrorMessage>::
Operation<duckdb::string_t,duckdb::date_t>
          (VectorTryCastErrorOperator<duckdb::TryCastErrorMessage> *this,string_t input,
          ValidityMask *mask,idx_t idx,void *dataptr)

{
  string *psVar1;
  string_t input_00;
  bool bVar2;
  date_t dVar3;
  PhysicalType type;
  string_t input_01;
  undefined4 uStack_d8;
  date_t output;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  string local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  input_01.value._0_8_ = input.value._0_8_;
  input_01.value.pointer.ptr = (char *)&output;
  bVar2 = TryCastErrorMessage::Operation<duckdb::string_t,duckdb::date_t>
                    ((TryCastErrorMessage *)this,input_01,*(date_t **)(idx + 8),
                     (CastParameters *)idx);
  if (!bVar2) {
    psVar1 = *(string **)(*(long *)(idx + 8) + 0x10);
    if ((psVar1 == (string *)0x0) || (*(long *)(psVar1 + 8) == 0)) {
      input_00.value._8_4_ = uStack_d8;
      input_00.value._0_8_ = 0x145bfdf;
      input_00.value._12_4_ = output.days;
      ConvertToString::Operation<duckdb::string_t>(input_00);
      ::std::operator+(&local_90,"Could not convert string \'",&local_50);
      ::std::operator+(&local_70,&local_90,"\' to ");
      TypeIdToString_abi_cxx11_(&local_b0,(duckdb *)0x7,type);
      ::std::operator+(&local_d0,&local_70,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_b0);
      ::std::__cxx11::string::~string((string *)&local_b0);
      ::std::__cxx11::string::~string((string *)&local_70);
      ::std::__cxx11::string::~string((string *)&local_90);
      ::std::__cxx11::string::~string((string *)&local_50);
    }
    else {
      ::std::__cxx11::string::string((string *)&local_d0,psVar1);
    }
    dVar3 = HandleVectorCastError::Operation<duckdb::date_t>
                      (&local_d0,input.value._8_8_,(idx_t)mask,(VectorTryCastData *)idx);
    ::std::__cxx11::string::~string((string *)&local_d0);
    output = dVar3;
  }
  return (date_t)output.days;
}

Assistant:

static RESULT_TYPE Operation(INPUT_TYPE input, ValidityMask &mask, idx_t idx, void *dataptr) {
		auto data = reinterpret_cast<VectorTryCastData *>(dataptr);
		RESULT_TYPE output;
		if (DUCKDB_LIKELY(OP::template Operation<INPUT_TYPE, RESULT_TYPE>(input, output, data->parameters))) {
			return output;
		}
		bool has_error = data->parameters.error_message && !data->parameters.error_message->empty();
		return HandleVectorCastError::Operation<RESULT_TYPE>(
		    has_error ? *data->parameters.error_message : CastExceptionText<INPUT_TYPE, RESULT_TYPE>(input), mask, idx,
		    *data);
	}